

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawSprite(vissprite_t *spr)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  long lVar4;
  BYTE *pBVar5;
  long lVar6;
  drawseg_t *pdVar7;
  bool bVar8;
  uint uVar9;
  uint32 uVar10;
  fixed_t fVar11;
  int iVar12;
  int32_t iVar13;
  lightlist_t *plVar14;
  drawseg_t *pdVar15;
  short *psVar16;
  lighttable_t *plVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  int local_1b8;
  int local_1b4;
  BYTE *local_140;
  int maxvoxely;
  int minvoxely;
  float fardepth;
  float neardepth;
  int h_3;
  double ceilingZ;
  double hz_3;
  int h_2;
  double floorz;
  double hz_2;
  int clip;
  int h_1;
  double local_d0;
  double hz_1;
  int h;
  double local_b8;
  double hz;
  double hzt;
  double hzb;
  double scale;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_90;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_8c;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_88;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_84;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_80;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_7c;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 local_78;
  uint local_74;
  long lStack_70;
  INTBOOL invertcolormap;
  sector_t_conflict *sec;
  FDynamicColormap *local_58;
  FDynamicColormap *mybasecolormap;
  F3DFloor *rover;
  lighttable_t *colormap;
  short *clip2;
  short *clip1;
  short botclip;
  short topclip;
  int r2;
  int r1;
  int x2;
  int x1;
  int i;
  drawseg_t *ds;
  vissprite_t *spr_local;
  
  rover = (F3DFloor *)(spr->Style).colormap;
  ds = (drawseg_t *)spr;
  if (((spr->field_0x90 & 1) == 0) && ((spr->field_13).pic == (FTexture *)0x0)) {
    if ((((fake3D & 1) == 0) || (sclipBottom < (double)(spr->gpos).Z)) &&
       (((fake3D & 2) == 0 || ((double)(spr->gpos).Z < sclipTop)))) {
      R_DrawParticle(spr);
    }
  }
  else {
    r1 = (int)spr->x1;
    r2 = (int)spr->x2;
    if ((((r1 < r2) && (spr->sector != (sector_t_conflict *)0x0)) &&
        (((fake3D & 1) == 0 || (sclipBottom < (double)(spr->field_3).field_0.gzt)))) &&
       (((fake3D & 2) == 0 || ((double)(spr->field_3).field_0.gzb < sclipTop)))) {
      if ((((fixedcolormap == 0) && (fixedlightlev < 0)) && (spr->sector->e != (extsector_t *)0x0))
         && (uVar9 = TArray<lightlist_t,_lightlist_t>::Size(&(spr->sector->e->XFloor).lightlist),
            uVar9 != 0)) {
        if ((fake3D & 2) == 0) {
          lVar4 = ds->bkup;
          TVector2<double>::TVector2((TVector2<double> *)&sec,&ViewPos);
          sclipTop = secplane_t::ZatPoint((secplane_t *)(lVar4 + 0xd8),(DVector2 *)&sec);
        }
        lStack_70 = 0;
        x2 = TArray<lightlist_t,_lightlist_t>::Size
                       ((TArray<lightlist_t,_lightlist_t> *)(*(long *)(ds->bkup + 0x210) + 0x80));
        do {
          dVar19 = sclipTop;
          x2 = x2 - 1;
          if (x2 < 0) goto LAB_0038ebdc;
          plVar14 = TArray<lightlist_t,_lightlist_t>::operator[]
                              ((TArray<lightlist_t,_lightlist_t> *)
                               (*(long *)(ds->bkup + 0x210) + 0x80),(long)x2);
          dVar18 = secplane_t::Zat0(&plVar14->plane);
        } while (dVar18 < dVar19);
        plVar14 = TArray<lightlist_t,_lightlist_t>::operator[]
                            ((TArray<lightlist_t,_lightlist_t> *)
                             (*(long *)(ds->bkup + 0x210) + 0x80),(long)x2);
        dVar19 = sclipTop;
        mybasecolormap = (FDynamicColormap *)plVar14->caster;
        if (((F3DFloor *)mybasecolormap != (F3DFloor *)0x0) &&
           (((((F3DFloor *)mybasecolormap)->flags & 0x10000) == 0 ||
            (dVar18 = secplane_t::Zat0((((F3DFloor *)mybasecolormap)->bottom).plane),
            dVar18 < dVar19)))) {
          lStack_70 = *(long *)&mybasecolormap[3].Color;
          if (((ulong)mybasecolormap[2].Next & 0x8000000) == 0) {
            plVar14 = TArray<lightlist_t,_lightlist_t>::operator[]
                                ((TArray<lightlist_t,_lightlist_t> *)
                                 (*(long *)(ds->bkup + 0x210) + 0x80),(long)x2);
            local_58 = plVar14->extra_colormap;
          }
          else {
            local_58 = *(FDynamicColormap **)(lStack_70 + 0x100);
          }
        }
LAB_0038ebdc:
        if (lStack_70 != 0) {
          bVar3 = *(byte *)((long)&ds[1].iscalestep + 3);
          local_74 = bVar3 & 0x20;
          if (((uint)ds[1].iscalestep & 0x10000000) != 0) {
            local_74 = (uint)(((bVar3 & 0x20) != 0 ^ 0xffU) & 1);
          }
          bVar8 = FRenderStyle::operator==((FRenderStyle *)&ds[1].iscalestep,LegacyRenderStyles + 7)
          ;
          if ((bVar8) &&
             (uVar10 = PalEntry::operator_cast_to_unsigned_int(&local_58->Fade), uVar10 != 0)) {
            local_78 = (local_58->Color).field_0.field_0;
            PalEntry::PalEntry((PalEntry *)&local_7c.field_0,0);
            local_58 = GetSpecialLights((PalEntry)local_78,(PalEntry)local_7c,local_58->Desaturate);
          }
          if (((uint)ds[1].iscalestep & 0x40000000) != 0) {
            if (local_74 == 0) {
              local_88 = (local_58->Color).field_0.field_0;
              PalEntry::PalEntry((PalEntry *)&local_8c.field_0,0);
              local_58 = GetSpecialLights((PalEntry)local_88,(PalEntry)local_8c,local_58->Desaturate
                                         );
            }
            else {
              local_80 = (local_58->Color).field_0.field_0;
              PalEntry::PalEntry((PalEntry *)&local_84.field_0,0xffffff);
              local_58 = GetSpecialLights((PalEntry)local_80,(PalEntry)local_84,local_58->Desaturate
                                         );
              local_74 = 0;
            }
          }
          if (local_74 != 0) {
            local_90 = (local_58->Color).field_0.field_0;
            scale._4_4_ = (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
                          PalEntry::InverseColor(&local_58->Fade);
            local_58 = GetSpecialLights((PalEntry)local_90,(PalEntry)scale._4_4_,
                                        local_58->Desaturate);
          }
          dVar19 = r_SpriteVisibility;
          if (fixedlightlev < 0) {
            if (((foggy & 1) == 0) && ((*(ushort *)&ds->field_0x94 & 0x10) != 0)) {
              bVar8 = FBoolCVar::operator_cast_to_bool(&r_fullbrightignoresectorcolor);
              if (bVar8) {
                local_140 = FullNormalLight.Maps;
              }
              else {
                local_140 = local_58->Maps;
              }
              *(BYTE **)&ds[1].light = local_140;
            }
            else {
              iVar12 = (*(short *)(lStack_70 + 0x112) + r_actualextralight + 0xc) * -0x4000 +
                       0x400000;
              pBVar5 = local_58->Maps;
              spriteshade = iVar12;
              dVar18 = MAX<double>(0.0078125,(double)ds->siz1);
              dVar19 = MIN<double>(24.0,dVar19 / dVar18);
              fVar11 = FloatToFixed(dVar19);
              iVar12 = clamp<int>(iVar12 - fVar11 >> 0x10,0,0x1f);
              *(BYTE **)&ds[1].light = pBVar5 + (iVar12 << 8);
            }
          }
          else {
            *(BYTE **)&ds[1].light = local_58->Maps + fixedlightlev;
          }
        }
      }
      dVar19 = CenterY;
      clip1._2_2_ = 0;
      clip1._0_2_ = (short)viewheight;
      hzb = InvZtoScale * (double)ds->siz2;
      hzt = 2.2250738585072014e-308;
      hz = 1.79769313486232e+308;
      if (((ds->CurrentPortalUniq & 1) != 0) &&
         ((*(double *)&ds->yscale != 0.0 || (NAN(*(double *)&ds->yscale))))) {
        hzt = (double)ds->iscale;
      }
      if ((*(long *)&ds->fake == 0) || ((*(ushort *)(*(long *)&ds->fake + 0x1ee) & 0x10) != 0)) {
        if (((ds->CurrentPortalUniq & 1) == 0) &&
           ((*(double *)&ds->yscale != 0.0 || (NAN(*(double *)&ds->yscale))))) {
          dVar18 = (double)ds->sprtopclip;
          iVar12 = FTexture::GetHeight(*(FTexture **)&ds->shade);
          iVar13 = xs_RoundToInt((real64)(dVar19 - ((dVar18 - (double)iVar12) +
                                                   *(double *)&ds->yscale) * (double)ds->sz2));
          if (iVar13 < (short)clip1) {
            clip1._0_2_ = MAX<short>(0,(short)iVar13);
          }
        }
      }
      else {
        if (*(char *)((long)&ds->CurrentPortalUniq + 1) != '\x02') {
          lVar4 = *(long *)&ds->fake;
          TVector2<float>::TVector2
                    ((TVector2<float> *)&stack0xffffffffffffff40,
                     (TVector3<float> *)((long)&ds->curline + 4));
          local_b8 = secplane_t::ZatPoint
                               ((secplane_t *)(lVar4 + 0xb0),(FVector2 *)&stack0xffffffffffffff40);
          hz_1._4_4_ = xs_RoundToInt((real64)(CenterY - (local_b8 - ViewPos.Z) * hzb));
          if (*(char *)((long)&ds->CurrentPortalUniq + 1) == '\x01') {
            if (((ds->CurrentPortalUniq & 1) == 0) && (clip1._2_2_ < hz_1._4_4_)) {
              iVar12 = MIN<int>(hz_1._4_4_,viewheight);
              clip1._2_2_ = (short)iVar12;
            }
            hz = MIN<double>(hz,local_b8);
          }
          else {
            if (((ds->CurrentPortalUniq & 1) == 0) && (hz_1._4_4_ < (short)clip1)) {
              clip1._0_2_ = MAX<short>(0,(short)hz_1._4_4_);
            }
            hzt = MAX<double>(hzt,local_b8);
          }
        }
        if ((*(char *)((long)&ds->CurrentPortalUniq + 1) != '\x01') &&
           ((*(ushort *)(*(long *)&ds->fake + 0x1ee) & 2) == 0)) {
          lVar4 = *(long *)&ds->fake;
          TVector2<float>::TVector2
                    ((TVector2<float> *)&clip,(TVector3<float> *)((long)&ds->curline + 4));
          local_d0 = secplane_t::ZatPoint((secplane_t *)(lVar4 + 0xd8),(FVector2 *)&clip);
          iVar13 = xs_RoundToInt((real64)(CenterY - (local_d0 - ViewPos.Z) * hzb));
          if (*(char *)((long)&ds->CurrentPortalUniq + 1) == '\x02') {
            if (((ds->CurrentPortalUniq & 1) == 0) && (iVar13 < (short)clip1)) {
              clip1._0_2_ = MAX<short>(0,(short)iVar13);
            }
            hzt = MAX<double>(hzt,local_d0);
          }
          else {
            if (((ds->CurrentPortalUniq & 1) == 0) && (clip1._2_2_ < iVar13)) {
              iVar12 = MIN<int>(iVar13,viewheight);
              clip1._2_2_ = (short)iVar12;
            }
            hz = MIN<double>(hz,local_d0);
          }
        }
      }
      if ((fake3D & 1) != 0) {
        if ((ds->CurrentPortalUniq & 1) == 0) {
          floorz = sclipBottom;
          lVar4._0_4_ = (ds->tmapvals).UoverZorg;
          lVar4._4_4_ = (ds->tmapvals).UoverZstep;
          if ((lVar4 != 0) &&
             (dVar19 = secplane_t::Zat0(*(secplane_t **)(*(long *)&ds->tmapvals + 0x28)),
             dVar19 < ViewPos.Z)) {
            if ((dVar19 == sclipBottom) && (!NAN(dVar19) && !NAN(sclipBottom))) {
              floorz = secplane_t::Zat0((secplane_t *)**(undefined8 **)&ds->tmapvals);
            }
          }
          iVar13 = xs_RoundToInt((real64)(CenterY - (floorz - ViewPos.Z) * hzb));
          if (iVar13 < (short)clip1) {
            clip1._0_2_ = MAX<short>(0,(short)iVar13);
          }
        }
        hzt = MAX<double>(hzt,sclipBottom);
      }
      if ((fake3D & 2) != 0) {
        if ((ds->CurrentPortalUniq & 1) == 0) {
          ceilingZ = sclipTop;
          lVar6._0_4_ = (ds->tmapvals).InvZorg;
          lVar6._4_4_ = (ds->tmapvals).InvZstep;
          if ((lVar6 != 0) &&
             (dVar19 = secplane_t::Zat0((secplane_t *)**(undefined8 **)&(ds->tmapvals).InvZorg),
             ViewPos.Z < dVar19)) {
            if ((dVar19 == sclipTop) && (!NAN(dVar19) && !NAN(sclipTop))) {
              ceilingZ = secplane_t::Zat0(*(secplane_t **)(*(long *)&(ds->tmapvals).InvZorg + 0x28))
              ;
            }
          }
          iVar13 = xs_RoundToInt((real64)(CenterY - (ceilingZ - ViewPos.Z) * hzb));
          if (clip1._2_2_ < iVar13) {
            iVar12 = MIN<int>(iVar13,viewheight);
            clip1._2_2_ = (short)iVar12;
          }
        }
        hz = MIN<double>(hz,sclipTop);
      }
      if (clip1._2_2_ < (short)clip1) {
        x2 = r2 - r1;
        colormap = (lighttable_t *)(R_DrawSprite::cliptop + r1);
        clip2 = R_DrawSprite::clipbot + r1;
        do {
          psVar16 = clip2 + 1;
          *clip2 = (short)clip1;
          plVar17 = colormap + 2;
          *(short *)colormap = clip1._2_2_;
          x2 = x2 + -1;
          colormap = plVar17;
          clip2 = psVar16;
        } while (x2 != 0);
        _x1 = ds_p;
        x2 = 0;
        pdVar15 = _x1;
        while (_x1 = pdVar15, pdVar15 = _x1 + -1, firstdrawseg < _x1) {
          if ((((_x1[-1].fake == 0) && (_x1[-1].x1 < r2)) && (r1 < _x1[-1].x2)) &&
             ((((_x1[-1].silhouette & 3) != 0 || (_x1[-1].maskedtexturecol != -1)) ||
              (_x1[-1].bFogBoundary != '\0')))) {
            pdVar7 = _x1 + -1;
            _x1 = pdVar15;
            _botclip = MAX<int>((int)pdVar7->x1,r1);
            clip1._4_4_ = MIN<int>((int)_x1->x2,r2);
            if (((byte)ds->CurrentPortalUniq >> 1 & 1) == 0) {
              if (_x1->sz2 <= _x1->sz1) {
                minvoxely = (int)_x1->sz2;
                maxvoxely = (int)_x1->sz1;
              }
              else {
                minvoxely = (int)_x1->sz1;
                maxvoxely = (int)_x1->sz2;
              }
            }
            if ((((byte)ds->CurrentPortalUniq >> 1 & 1) != 0) ||
               ((float)minvoxely < ds->siz1 || (float)minvoxely == ds->siz1)) {
              if ((((byte)ds->CurrentPortalUniq >> 1 & 1) != 0) ||
                 (ds->siz1 <= (float)maxvoxely && (float)maxvoxely != ds->siz1)) {
                fVar1 = ds->light;
                dVar19 = vertex_t::fY(_x1->curline->v1);
                dVar18 = vertex_t::fX(_x1->curline->v2);
                dVar20 = vertex_t::fX(_x1->curline->v1);
                fVar2 = *(float *)((long)&ds->curline + 4);
                dVar21 = vertex_t::fX(_x1->curline->v1);
                dVar22 = vertex_t::fY(_x1->curline->v2);
                dVar23 = vertex_t::fY(_x1->curline->v1);
                if (((double)fVar1 - dVar19) * (dVar18 - dVar20) -
                    ((double)fVar2 - dVar21) * (dVar22 - dVar23) <= 0.0) goto LAB_0038f82c;
              }
              if ((_x1->silhouette & 1) != 0) {
                clip2 = R_DrawSprite::clipbot + _botclip;
                colormap = (lighttable_t *)
                           (openings + _x1->sprbottomclip * 2 + (long)_botclip * 2 +
                           (long)(int)_x1->x1 * -2);
                x2 = clip1._4_4_ - _botclip;
                do {
                  if (*(short *)colormap < *clip2) {
                    *clip2 = *(short *)colormap;
                  }
                  clip2 = clip2 + 1;
                  colormap = colormap + 2;
                  x2 = x2 + -1;
                } while (x2 != 0);
                x2 = 0;
              }
              pdVar15 = _x1;
              if ((_x1->silhouette & 2) != 0) {
                clip2 = R_DrawSprite::cliptop + _botclip;
                colormap = (lighttable_t *)
                           (openings + _x1->sprtopclip * 2 + (long)_botclip * 2 +
                           (long)(int)_x1->x1 * -2);
                x2 = clip1._4_4_ - _botclip;
                do {
                  if (*clip2 < *(short *)colormap) {
                    *clip2 = *(short *)colormap;
                  }
                  clip2 = clip2 + 1;
                  colormap = colormap + 2;
                  x2 = x2 + -1;
                } while (x2 != 0);
                x2 = 0;
              }
            }
            else {
LAB_0038f82c:
              pdVar15 = _x1;
              if ((_x1->CurrentPortalUniq == CurrentPortalUniq) &&
                 ((_x1->maskedtexturecol != -1 || (_x1->bFogBoundary != '\0')))) {
                R_RenderMaskedSegRange(_x1,_botclip,clip1._4_4_);
                pdVar15 = _x1;
              }
            }
          }
        }
        if ((ds->CurrentPortalUniq & 1) == 0) {
          mfloorclip = R_DrawSprite::clipbot;
          mceilingclip = R_DrawSprite::cliptop;
          if (((byte)ds->CurrentPortalUniq >> 1 & 1) == 0) {
            _x1 = pdVar15;
            R_DrawVisSprite((vissprite_t *)ds);
          }
          else {
            _x1 = pdVar15;
            R_DrawWallSprite((vissprite_t *)ds);
          }
        }
        else {
          if (R_DrawSprite::clipbot[r2] <= R_DrawSprite::cliptop[r2]) {
            for (x2 = r1; (x2 < r2 && (R_DrawSprite::clipbot[x2] <= R_DrawSprite::cliptop[x2]));
                x2 = x2 + 1) {
            }
            if (x2 == r2) {
              *(F3DFloor **)&ds[1].light = rover;
              return;
            }
          }
          _x1 = pdVar15;
          if (0 < r1) {
            fillshort(R_DrawSprite::cliptop,r1,(WORD)viewheight);
          }
          if (r2 < viewwidth + -1) {
            fillshort(R_DrawSprite::cliptop + r2,viewwidth - r2,(WORD)viewheight);
          }
          if (hz < (double)ds->iscalestep) {
            local_1b4 = xs_RoundToInt((real64)(((double)ds->iscalestep - hz) / (double)ds->sz2));
          }
          else {
            local_1b4 = 0;
          }
          if ((double)ds->iscale <= hzt) {
            local_1b8 = xs_RoundToInt((real64)(((double)ds->iscalestep - hzt) / (double)ds->sz2));
          }
          else {
            local_1b8 = 0x7fffffff;
          }
          R_DrawVisVoxel((vissprite_t *)ds,local_1b4,local_1b8,R_DrawSprite::cliptop,
                         R_DrawSprite::clipbot);
        }
        *(F3DFloor **)&ds[1].light = rover;
      }
      else {
        *(F3DFloor **)&ds[1].light = rover;
      }
    }
  }
  return;
}

Assistant:

void R_DrawSprite (vissprite_t *spr)
{
	static short clipbot[MAXWIDTH];
	static short cliptop[MAXWIDTH];
	drawseg_t *ds;
	int i;
	int x1, x2;
	int r1, r2;
	short topclip, botclip;
	short *clip1, *clip2;
	lighttable_t *colormap = spr->Style.colormap;
	F3DFloor *rover;
	FDynamicColormap *mybasecolormap;

	// [RH] Check for particles
	if (!spr->bIsVoxel && spr->pic == NULL)
	{
		// kg3D - reject invisible parts
		if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gpos.Z <= sclipBottom) return;
		if ((fake3D & FAKE3D_CLIPTOP)    && spr->gpos.Z >= sclipTop) return;
		R_DrawParticle (spr);
		return;
	}

	x1 = spr->x1;
	x2 = spr->x2;

	// [RH] Quickly reject sprites with bad x ranges.
	if (x1 >= x2)
		return;

	// [RH] Sprites split behind a one-sided line can also be discarded.
	if (spr->sector == NULL)
		return;

	// kg3D - reject invisible parts
	if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gzt <= sclipBottom) return;
	if ((fake3D & FAKE3D_CLIPTOP)    && spr->gzb >= sclipTop) return;

	// kg3D - correct colors now
	if (!fixedcolormap && fixedlightlev < 0 && spr->sector->e && spr->sector->e->XFloor.lightlist.Size()) 
	{
		if (!(fake3D & FAKE3D_CLIPTOP))
		{
			sclipTop = spr->sector->ceilingplane.ZatPoint(ViewPos);
		}
		sector_t *sec = NULL;
		for (i = spr->sector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (sclipTop <= spr->sector->e->XFloor.lightlist[i].plane.Zat0()) 
			{
				rover = spr->sector->e->XFloor.lightlist[i].caster;
				if (rover) 
				{
					if (rover->flags & FF_DOUBLESHADOW && sclipTop <= rover->bottom.plane->Zat0())
					{
						break;
					}
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
					{
						mybasecolormap = sec->ColorMap;
					}
					else
					{
						mybasecolormap = spr->sector->e->XFloor.lightlist[i].extra_colormap;
					}
				}
				break;
			}
		}
		// found new values, recalculate
		if (sec) 
		{
			INTBOOL invertcolormap = (spr->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

			if (spr->Style.RenderStyle.Flags & STYLEF_InvertSource)
			{
				invertcolormap = !invertcolormap;
			}

			// Sprites that are added to the scene must fade to black.
			if (spr->Style.RenderStyle == LegacyRenderStyles[STYLE_Add] && mybasecolormap->Fade != 0)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, 0, mybasecolormap->Desaturate);
			}

			if (spr->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
			{
				if (invertcolormap)
				{ // Fade to white
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255,255,255), mybasecolormap->Desaturate);
					invertcolormap = false;
				}
				else
				{ // Fade to black
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0,0,0), mybasecolormap->Desaturate);
				}
			}

			// get light level
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				spr->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && (spr->renderflags & RF_FULLBRIGHT))
			{ // full bright
				spr->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;
			}
			else
			{ // diminished light
				spriteshade = LIGHT2SHADE(sec->lightlevel + r_actualextralight);
				spr->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(
					r_SpriteVisibility / MAX(MINZ, (double)spr->depth), spriteshade) << COLORMAPSHIFT);
			}
		}
	}

	// [RH] Initialize the clipping arrays to their largest possible range
	// instead of using a special "not clipped" value. This eliminates
	// visual anomalies when looking down and should be faster, too.
	topclip = 0;
	botclip = viewheight;

	// killough 3/27/98:
	// Clip the sprite against deep water and/or fake ceilings.
	// [RH] rewrote this to be based on which part of the sector is really visible

	double scale = InvZtoScale * spr->idepth;
	double hzb = DBL_MIN, hzt = DBL_MAX;

	if (spr->bIsVoxel && spr->floorclip != 0)
	{
		hzb = spr->gzb;
	}

	if (spr->heightsec && !(spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC))
	{ // only things in specially marked sectors
		if (spr->FakeFlatStat != FAKED_AboveCeiling)
		{
			double hz = spr->heightsec->floorplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_BelowFloor)
			{ // seen below floor: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = short(MIN(h, viewheight));
				}
				hzt = MIN(hzt, hz);
			}
			else
			{ // seen in the middle: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
		}
		if (spr->FakeFlatStat != FAKED_BelowFloor && !(spr->heightsec->MoreFlags & SECF_FAKEFLOORONLY))
		{
			double hz = spr->heightsec->ceilingplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_AboveCeiling)
			{ // seen above ceiling: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
			else
			{ // seen in the middle: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = MIN(h, viewheight);
				}
				hzt = MIN(hzt, hz);
			}
		}
	}
	// killough 3/27/98: end special clipping for deep water / fake ceilings
	else if (!spr->bIsVoxel && spr->floorclip)
	{ // [RH] Move floorclip stuff from R_DrawVisSprite to here
		//int clip = ((FLOAT2FIXED(CenterY) - FixedMul (spr->texturemid - (spr->pic->GetHeight() << FRACBITS) + spr->floorclip, spr->yscale)) >> FRACBITS);
		int clip = xs_RoundToInt(CenterY - (spr->texturemid - spr->pic->GetHeight() + spr->floorclip) * spr->yscale);
		if (clip < botclip)
		{
			botclip = MAX<short>(0, clip);
		}
	}

	if (fake3D & FAKE3D_CLIPBOTTOM)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipBottom;
			if (spr->fakefloor)
			{
				double floorz = spr->fakefloor->top.plane->Zat0();
				if (ViewPos.Z > floorz && floorz == sclipBottom )
				{
					hz = spr->fakefloor->bottom.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h < botclip)
			{
				botclip = MAX<short>(0, h);
			}
		}
		hzb = MAX(hzb, sclipBottom);
	}
	if (fake3D & FAKE3D_CLIPTOP)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipTop;
			if (spr->fakeceiling != NULL)
			{
				double ceilingZ = spr->fakeceiling->bottom.plane->Zat0();
				if (ViewPos.Z < ceilingZ && ceilingZ == sclipTop)
				{
					hz = spr->fakeceiling->top.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h > topclip)
			{
				topclip = short(MIN(h, viewheight));
			}
		}
		hzt = MIN(hzt, sclipTop);
	}

#if 0
	// [RH] Sprites that were split by a drawseg should also be clipped
	// by the sector's floor and ceiling. (Not sure how/if to handle this
	// with fake floors, since those already do clipping.)
	if (spr->bSplitSprite &&
		(spr->heightsec == NULL || (spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)))
	{
		fixed_t h = spr->sector->floorplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h < botclip)
		{
			botclip = MAX<short> (0, h);
		}
		h = spr->sector->ceilingplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h > topclip)
		{
			topclip = short(MIN(h, viewheight));
		}
	}
#endif

	if (topclip >= botclip)
	{
		spr->Style.colormap = colormap;
		return;
	}

	i = x2 - x1;
	clip1 = clipbot + x1;
	clip2 = cliptop + x1;
	do
	{
		*clip1++ = botclip;
		*clip2++ = topclip;
	} while (--i);

	// Scan drawsegs from end to start for obscuring segs.
	// The first drawseg that is closer than the sprite is the clip seg.

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	for (ds = ds_p; ds-- > firstdrawseg; )  // new -- killough
	{
		// [ZZ] portal handling here
		//if (ds->CurrentPortalUniq != spr->CurrentPortalUniq)
		//	continue;
		// [ZZ] WARNING: uncommenting the two above lines, totally breaks sprite clipping

		// kg3D - no clipping on fake segs
		if (ds->fake) continue;
		// determine if the drawseg obscures the sprite
		if (ds->x1 >= x2 || ds->x2 <= x1 ||
			(!(ds->silhouette & SIL_BOTH) && ds->maskedtexturecol == -1 &&
			 !ds->bFogBoundary) )
		{
			// does not cover sprite
			continue;
		}

		r1 = MAX<int> (ds->x1, x1);
		r2 = MIN<int> (ds->x2, x2);

		float neardepth, fardepth;
		if (!spr->bWallSprite)
		{
			if (ds->sz1 < ds->sz2)
			{
				neardepth = ds->sz1, fardepth = ds->sz2;
			}
			else
			{
				neardepth = ds->sz2, fardepth = ds->sz1;
			}
		}
		// Check if sprite is in front of draw seg:
		if ((!spr->bWallSprite && neardepth > spr->depth) || ((spr->bWallSprite || fardepth > spr->depth) &&
			(spr->gpos.Y - ds->curline->v1->fY()) * (ds->curline->v2->fX() - ds->curline->v1->fX()) -
			(spr->gpos.X - ds->curline->v1->fX()) * (ds->curline->v2->fY() - ds->curline->v1->fY()) <= 0))
		{
			// seg is behind sprite, so draw the mid texture if it has one
			if (ds->CurrentPortalUniq == CurrentPortalUniq && // [ZZ] instead, portal uniq check is made here
				(ds->maskedtexturecol != -1 || ds->bFogBoundary))
				R_RenderMaskedSegRange (ds, r1, r2);
			continue;
		}

		// clip this piece of the sprite
		// killough 3/27/98: optimized and made much shorter
		// [RH] Optimized further (at least for VC++;
		// other compilers should be at least as good as before)

		if (ds->silhouette & SIL_BOTTOM) //bottom sil
		{
			clip1 = clipbot + r1;
			clip2 = openings + ds->sprbottomclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 > *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}

		if (ds->silhouette & SIL_TOP)   // top sil
		{
			clip1 = cliptop + r1;
			clip2 = openings + ds->sprtopclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 < *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}
	}

	// all clipping has been performed, so draw the sprite

	if (!spr->bIsVoxel)
	{
		mfloorclip = clipbot;
		mceilingclip = cliptop;
		if (!spr->bWallSprite)
		{
			R_DrawVisSprite(spr);
		}
		else
		{
			R_DrawWallSprite(spr);
		}
	}
	else
	{
		// If it is completely clipped away, don't bother drawing it.
		if (cliptop[x2] >= clipbot[x2])
		{
			for (i = x1; i < x2; ++i)
			{
				if (cliptop[i] < clipbot[i])
				{
					break;
				}
			}
			if (i == x2)
			{
				spr->Style.colormap = colormap;
				return;
			}
		}
		// Add everything outside the left and right edges to the clipping array
		// for R_DrawVisVoxel().
		if (x1 > 0)
		{
			fillshort(cliptop, x1, viewheight);
		}
		if (x2 < viewwidth - 1)
		{
			fillshort(cliptop + x2, viewwidth - x2, viewheight);
		}
		int minvoxely = spr->gzt <= hzt ? 0 : xs_RoundToInt((spr->gzt - hzt) / spr->yscale);
		int maxvoxely = spr->gzb > hzb ? INT_MAX : xs_RoundToInt((spr->gzt - hzb) / spr->yscale);
		R_DrawVisVoxel(spr, minvoxely, maxvoxely, cliptop, clipbot);
	}
	spr->Style.colormap = colormap;
}